

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* cxxopts::values::parser_tool::SplitSwitchDef(string *text)

{
  bool bVar1;
  const_reference this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string *long_sw;
  string *short_sw;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  sub_match<const_char_*> *in_stack_ffffffffffffff48;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  *in_stack_ffffffffffffff50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *text_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff70;
  string local_68 [32];
  string *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __a = &local_30;
  text_00 = in_RDI;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results(in_stack_ffffffffffffff50);
  std::__cxx11::string::c_str();
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            ((char *)in_stack_ffffffffffffff70,
             (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *
             )__a,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)text_00,
             (match_flag_type)((ulong)in_RDI >> 0x20));
  bVar1 = std::__cxx11::
          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
          empty((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 *)0x11e268);
  if (bVar1) {
    throw_or_mimic<cxxopts::invalid_option_format_error>(&text_00->first);
  }
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                *)text_00,(size_type)in_RDI);
  std::__cxx11::sub_match::operator_cast_to_string(in_stack_ffffffffffffff48);
  local_48 = local_68;
  this = std::__cxx11::
         match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
         operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     *)text_00,(size_type)in_RDI);
  std::__cxx11::sub_match::operator_cast_to_string(this);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffff70,__a,&text_00->first);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)0x11e332);
  return text_00;
}

Assistant:

inline std::pair<std::string, std::string> SplitSwitchDef(const std::string &text)
      {
        std::match_results<const char*> result;
        std::regex_match(text.c_str(), result, option_specifier);
        if (result.empty())
        {
          throw_or_mimic<invalid_option_format_error>(text);
        }

        const std::string& short_sw = result[2];
        const std::string& long_sw = result[3];

        return std::pair<std::string, std::string>(short_sw, long_sw);
      }